

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcSpfd.c
# Opt level: O1

void Bdc_SpfdDecomposeTest3(void)

{
  Vec_Wrd_t *p;
  word *pwVar1;
  word wVar2;
  Vec_Wrd_t *p_00;
  long lVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  timespec ts;
  timespec local_40;
  
  Aig_ManRandom64(1);
  p = (Vec_Wrd_t *)malloc(0x10);
  p->nCap = 0x4000000;
  p->nSize = 0;
  pwVar1 = (word *)malloc(0x20000000);
  p->pArray = pwVar1;
  iVar5 = 0x4000000;
  do {
    wVar2 = Aig_ManRandom64(0);
    Vec_WrdPush(p,wVar2);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  p_00 = (Vec_Wrd_t *)malloc(0x10);
  p_00->nCap = 0x10;
  p_00->nSize = 0;
  pwVar1 = (word *)malloc(0x80);
  p_00->pArray = pwVar1;
  iVar5 = 8;
  do {
    wVar2 = Aig_ManRandom64(0);
    Vec_WrdPush(p_00,wVar2);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  iVar5 = clock_gettime(3,&local_40);
  if (iVar5 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  lVar4 = 0;
  uVar6 = 0;
  do {
    lVar8 = 0;
    do {
      uVar6 = (ulong)((int)uVar6 + (uint)((p_00->pArray[lVar8] & ~p->pArray[lVar4]) == 0));
      lVar8 = lVar8 + 1;
    } while (lVar8 != 8);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x4000000);
  printf("Total = %8d.  ",uVar6);
  iVar7 = 3;
  iVar5 = clock_gettime(3,&local_40);
  if (iVar5 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  uVar9 = 0;
  Abc_Print(iVar7,"%s =","Time");
  Abc_Print(iVar7,"%9.2f sec\n",(double)(lVar4 + lVar3) / 1000000.0);
  iVar5 = clock_gettime(3,&local_40);
  if (iVar5 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  lVar4 = 0;
  do {
    lVar8 = 0;
    do {
      uVar9 = uVar9 + ((~p->pArray[lVar8] & p_00->pArray[lVar4]) == 0);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x4000000);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 8);
  printf("Total = %8d.  ",(ulong)uVar9);
  iVar7 = 3;
  iVar5 = clock_gettime(3,&local_40);
  if (iVar5 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Abc_Print(iVar7,"%s =","Time");
  Abc_Print(iVar7,"%9.2f sec\n",(double)(lVar4 + lVar3) / 1000000.0);
  return;
}

Assistant:

void Bdc_SpfdDecomposeTest3()
{
    int nSizeM = (1 << 26);
    int nSizeK = (1 << 3);
    Vec_Wrd_t * v1M;
    Vec_Wrd_t * v1K;
    int i, k, Counter;
    abctime clk;
//    int EntryM, EntryK;
    Aig_ManRandom64( 1 );

    v1M = Vec_WrdAlloc( nSizeM );
    for ( i = 0; i < nSizeM; i++ )
        Vec_WrdPush( v1M, Aig_ManRandom64(0) );

    v1K = Vec_WrdAlloc( nSizeK );
    for ( i = 0; i < nSizeK; i++ )
        Vec_WrdPush( v1K, Aig_ManRandom64(0) );

    clk = Abc_Clock();
    Counter = 0;
    for ( i = 0; i < nSizeM; i++ )
    for ( k = 0; k < nSizeK; k++ )
        Counter += ((v1M->pArray[i] & v1K->pArray[k]) == v1K->pArray[k]);
//    Vec_WrdForEachEntry( v1M, EntryM, i )
//    Vec_WrdForEachEntry( v1K, EntryK, k )
//        Counter += ((EntryM & EntryK) == EntryK);

    printf( "Total = %8d.  ", Counter );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    clk = Abc_Clock();
    Counter = 0;
    for ( k = 0; k < nSizeK; k++ )
    for ( i = 0; i < nSizeM; i++ )
        Counter += ((v1M->pArray[i] & v1K->pArray[k]) == v1K->pArray[k]);
    printf( "Total = %8d.  ", Counter );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

}